

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

fio_protocol_s *
fio_cluster_protocol_alloc
          (intptr_t uuid,_func_void_cluster_pr_s_ptr *handler,_func_void_void_ptr_intptr_t *sender)

{
  fio_protocol_s *pfVar1;
  int *piVar2;
  
  pfVar1 = (fio_protocol_s *)big_alloc(0x40c8);
  if (pfVar1 != (fio_protocol_s *)0x0) {
    pfVar1->on_data = fio_cluster_on_data;
    pfVar1->on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar1->on_shutdown = fio_cluster_on_shutdown;
    pfVar1->on_close = fio_cluster_on_close;
    pfVar1->ping = fio_cluster_ping;
    pfVar1->rsv = 0;
    pfVar1[3].on_close = (_func_void_intptr_t_fio_protocol_s_ptr *)uuid;
    pfVar1[1].on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)handler;
    pfVar1[1].on_shutdown = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)sender;
    pfVar1[1].on_close = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar1[1].ping = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar1[1].rsv = 0;
    pfVar1[2].on_data = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar1[2].on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar1[2].on_shutdown = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar1[2].on_close = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar1[2].ping = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar1[2].rsv = 0;
    pfVar1[3].on_data = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar1[3].on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    pfVar1[3].on_shutdown = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x0;
    *(undefined1 *)((long)&pfVar1[4].on_data + 4) = 0;
    return pfVar1;
  }
  if (0 < FIO_LOG_LEVEL) {
    FIO_LOG2STDERR("FATAL: Cluster protocol allocation failed.");
  }
  piVar2 = __errno_location();
  exit(*piVar2);
}

Assistant:

static inline fio_protocol_s *
fio_cluster_protocol_alloc(intptr_t uuid,
                           void (*handler)(struct cluster_pr_s *pr),
                           void (*sender)(void *data, intptr_t auuid)) {
  cluster_pr_s *p = fio_mmap(sizeof(*p));
  if (!p) {
    FIO_LOG_FATAL("Cluster protocol allocation failed.");
    exit(errno);
  }
  p->protocol = (fio_protocol_s){
      .ping = fio_cluster_ping,
      .on_close = fio_cluster_on_close,
      .on_shutdown = fio_cluster_on_shutdown,
      .on_data = fio_cluster_on_data,
  };
  p->uuid = uuid;
  p->handler = handler;
  p->sender = sender;
  p->pubsub = (fio_sub_hash_s)FIO_SET_INIT;
  p->patterns = (fio_sub_hash_s)FIO_SET_INIT;
  p->lock = FIO_LOCK_INIT;
  return &p->protocol;
}